

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::blitStencilToColor2D
               (RenderContext *renderCtx,deUint32 srcTex,int width,int height)

{
  void **__return_storage_ptr__;
  code *pcVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  ProgramSources *pPVar7;
  undefined4 extraout_var;
  TestError *this;
  VertexArrayBinding *local_4b8;
  PrimitiveList local_3f8;
  undefined1 local_3da;
  allocator<char> local_3d9;
  string local_3d8;
  long local_3b8;
  Functions *gl;
  deUint8 indices [6];
  allocator<char> local_381;
  string local_380;
  void **local_360;
  undefined1 local_358 [8];
  VertexArrayBinding vertexArrays [2];
  float texCoord [8];
  float positions [8];
  allocator<char> local_269;
  string local_268;
  ShaderSource local_248;
  allocator<char> local_209;
  string local_208;
  ShaderSource local_1e8;
  ProgramSources local_1c0;
  undefined1 local_f0 [8];
  ShaderProgram program;
  int height_local;
  int width_local;
  deUint32 srcTex_local;
  RenderContext *renderCtx_local;
  
  program.m_program.m_info.linkTimeUs._4_4_ = height;
  glu::ProgramSources::ProgramSources(&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_texCoord;\nout highp vec2 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
             ,&local_209);
  glu::VertexSource::VertexSource((VertexSource *)&local_1e8,&local_208);
  pPVar7 = glu::ProgramSources::operator<<(&local_1c0,&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "#version 300 es\nuniform highp usampler2D u_sampler;\nin highp vec2 v_texCoord;\nlayout(location = 0) out highp uint o_stencil;\nvoid main (void)\n{\n\to_stencil = texture(u_sampler, v_texCoord).x;\n}\n"
             ,&local_269);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_248,&local_268);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_248);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f0,renderCtx,pPVar7);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  texCoord[6] = -1.0;
  texCoord[7] = -1.0;
  texCoord[2] = 0.0;
  texCoord[3] = 1.0;
  texCoord[4] = 1.0;
  texCoord[5] = 1.0;
  vertexArrays[1].pointer.data = (void *)0x0;
  texCoord[0] = 1.0;
  texCoord[1] = 0.0;
  gl._6_1_ = 1;
  local_360 = (void **)local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"a_position",&local_381);
  glu::va::Float((VertexArrayBinding *)local_358,&local_380,2,4,0,texCoord + 6);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_360 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)indices,"a_texCoord",(allocator<char> *)((long)&gl + 7));
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,(string *)indices,2,4,0,
                 (float *)&vertexArrays[1].pointer.data);
  gl._6_1_ = 0;
  std::__cxx11::string::~string((string *)indices);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  gl._4_2_ = 0x301;
  gl._0_4_ = 0x2020100;
  iVar4 = (*renderCtx->_vptr_RenderContext[3])();
  local_3b8 = CONCAT44(extraout_var,iVar4);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_f0);
  if (!bVar3) {
    local_3da = 1;
    this = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"Compile failed",&local_3d9);
    tcu::TestError::TestError(this,&local_3d8);
    local_3da = 0;
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(local_3b8 + 8))(0x84c0);
  (**(code **)(local_3b8 + 0xb8))(0xde1,srcTex);
  (**(code **)(local_3b8 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(local_3b8 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(local_3b8 + 0x1360))(0xde1,0x90ea,0x1901);
  dVar5 = (**(code **)(local_3b8 + 0x800))();
  glu::checkError(dVar5,"Texture state setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0xfd);
  pcVar1 = *(code **)(local_3b8 + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
  (*pcVar1)(dVar5);
  pcVar1 = *(code **)(local_3b8 + 0x14f0);
  pcVar2 = *(code **)(local_3b8 + 0xb48);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
  uVar6 = (*pcVar2)(dVar5,"u_sampler");
  (*pcVar1)(uVar6,0);
  dVar5 = (**(code **)(local_3b8 + 0x800))();
  glu::checkError(dVar5,"Program setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x101);
  (**(code **)(local_3b8 + 0x1a00))(0,0,width,program.m_program.m_info.linkTimeUs._4_4_);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
  glu::pr::Triangles(&local_3f8,6,(deUint8 *)&gl);
  glu::draw(renderCtx,dVar5,2,(VertexArrayBinding *)local_358,&local_3f8,(DrawUtilCallback *)0x0);
  local_4b8 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
  do {
    local_4b8 = local_4b8 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_4b8);
  } while (local_4b8 != (VertexArrayBinding *)local_358);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f0);
  return;
}

Assistant:

static void blitStencilToColor2D (const glu::RenderContext& renderCtx, deUint32 srcTex, int width, int height)
{
	const glu::ShaderProgram program(renderCtx, glu::ProgramSources()
		<< glu::VertexSource(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"in highp vec2 a_texCoord;\n"
			"out highp vec2 v_texCoord;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"	v_texCoord = a_texCoord;\n"
			"}\n")
		<< glu::FragmentSource(
			"#version 300 es\n"
			"uniform highp usampler2D u_sampler;\n"
			"in highp vec2 v_texCoord;\n"
			"layout(location = 0) out highp uint o_stencil;\n"
			"void main (void)\n"
			"{\n"
			"	o_stencil = texture(u_sampler, v_texCoord).x;\n"
			"}\n"));

	const float positions[] =
	{
		-1.0f, -1.0f,
		+1.0f, -1.0f,
		-1.0f, +1.0f,
		+1.0f, +1.0f
	};
	const float texCoord[] =
	{
		0.0f, 0.0f,
		1.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 1.0f
	};
	const glu::VertexArrayBinding vertexArrays[] =
	{
		glu::va::Float("a_position", 2, 4, 0, &positions[0]),
		glu::va::Float("a_texCoord", 2, 4, 0, &texCoord[0])
	};
	const deUint8 indices[] = { 0, 1, 2, 2, 1, 3 };

	const glw::Functions& gl = renderCtx.getFunctions();

	if (!program.isOk())
		throw tcu::TestError("Compile failed");

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, srcTex);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, GL_STENCIL_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture state setup failed");

	gl.useProgram(program.getProgram());
	gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_sampler"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program setup failed");

	gl.viewport(0, 0, width, height);
	glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
}